

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

void __thiscall llvm::detail::DoubleAPFloat::makeLargest(DoubleAPFloat *this,bool Neg)

{
  anon_union_8_2_1313ab2f_for_U local_60;
  undefined4 local_58;
  Storage local_48;
  
  if (this->Semantics == (fltSemantics *)semPPCDoubleDouble) {
    local_60.pVal = (uint64_t *)0x7fefffffffffffff;
    local_58 = 0x40;
    APInt::clearUnusedBits((APInt *)&local_60);
    IEEEFloat::IEEEFloat(&local_48.IEEE,(fltSemantics *)semIEEEdouble,(APInt *)&local_60);
    APFloat::Storage::operator=
              ((Storage *)
               &(((this->Floats)._M_t.
                  super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                  super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                  super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl)->U).IEEE,&local_48);
    APFloat::Storage::~Storage((Storage *)&local_48.IEEE);
    APInt::~APInt((APInt *)&local_60);
    local_60.pVal = (uint64_t *)0x7c8ffffffffffffe;
    local_58 = 0x40;
    APInt::clearUnusedBits((APInt *)&local_60);
    IEEEFloat::IEEEFloat(&local_48.IEEE,(fltSemantics *)semIEEEdouble,(APInt *)&local_60);
    APFloat::Storage::operator=
              ((Storage *)
               &(this->Floats)._M_t.
                super___uniq_ptr_impl<llvm::APFloat,_std::default_delete<llvm::APFloat[]>_>._M_t.
                super__Tuple_impl<0UL,_llvm::APFloat_*,_std::default_delete<llvm::APFloat[]>_>.
                super__Head_base<0UL,_llvm::APFloat_*,_false>._M_head_impl[1].U.IEEE,&local_48);
    APFloat::Storage::~Storage((Storage *)&local_48.IEEE);
    APInt::~APInt((APInt *)&local_60);
    if (Neg) {
      changeSign(this);
    }
    return;
  }
  __assert_fail("Semantics == &semPPCDoubleDouble && \"Unexpected Semantics\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                ,0x1084,"void llvm::detail::DoubleAPFloat::makeLargest(bool)");
}

Assistant:

void DoubleAPFloat::makeLargest(bool Neg) {
  assert(Semantics == &semPPCDoubleDouble && "Unexpected Semantics");
  Floats[0] = APFloat(semIEEEdouble, APInt(64, 0x7fefffffffffffffull));
  Floats[1] = APFloat(semIEEEdouble, APInt(64, 0x7c8ffffffffffffeull));
  if (Neg)
    changeSign();
}